

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

GLFWbool waitForEvent(double *timeout)

{
  int iVar1;
  int iVar2;
  uint64_t uVar3;
  int *piVar4;
  uint64_t uVar5;
  long lVar6;
  double *in_RDI;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int error;
  int result;
  uint64_t base;
  timeval tv;
  long microseconds;
  long seconds;
  fd_set *__arr;
  uint __i;
  int count;
  int fd;
  fd_set fds;
  timeval local_c8;
  long local_b8;
  long local_b0;
  fd_set *local_a8;
  uint local_9c;
  int local_98;
  int local_94;
  fd_set local_90;
  double *local_10;
  
  local_94 = *(int *)(_glfw.x11.display + 0x10);
  local_98 = local_94 + 1;
  local_10 = in_RDI;
  if (local_94 < _glfw.linjs.inotify) {
    local_98 = _glfw.linjs.inotify + 1;
  }
  do {
    while( true ) {
      local_a8 = &local_90;
      for (local_9c = 0; local_9c < 0x10; local_9c = local_9c + 1) {
        local_a8->fds_bits[local_9c] = 0;
      }
      local_90.fds_bits[local_94 / 0x40] =
           1L << ((byte)((long)local_94 % 0x40) & 0x3f) | local_90.fds_bits[local_94 / 0x40];
      if (0 < _glfw.linjs.inotify) {
        local_90.fds_bits[_glfw.linjs.inotify / 0x40] =
             1L << ((byte)((long)_glfw.linjs.inotify % 0x40) & 0x3f) |
             local_90.fds_bits[_glfw.linjs.inotify / 0x40];
      }
      if (local_10 != (double *)0x0) break;
      iVar2 = select(local_98,&local_90,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
      if ((iVar2 != -1) || (piVar4 = __errno_location(), *piVar4 != 4)) {
        return 1;
      }
    }
    local_c8.tv_sec = (__time_t)*local_10;
    local_c8.tv_usec = (__suseconds_t)((*local_10 - (double)local_c8.tv_sec) * 1000000.0);
    local_b8 = local_c8.tv_usec;
    local_b0 = local_c8.tv_sec;
    uVar3 = _glfwPlatformGetTimerValue();
    iVar1 = select(local_98,&local_90,(fd_set *)0x0,(fd_set *)0x0,&local_c8);
    piVar4 = __errno_location();
    iVar2 = *piVar4;
    uVar5 = _glfwPlatformGetTimerValue();
    lVar6 = uVar5 - uVar3;
    auVar7._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar7._0_8_ = lVar6;
    auVar7._12_4_ = 0x45300000;
    uVar3 = _glfwPlatformGetTimerFrequency();
    auVar8._8_4_ = (int)(uVar3 >> 0x20);
    auVar8._0_8_ = uVar3;
    auVar8._12_4_ = 0x45300000;
    *local_10 = *local_10 -
                ((auVar7._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) /
                ((auVar8._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
    if (0 < iVar1) {
      return 1;
    }
  } while (((iVar1 != -1) || (iVar2 != 4)) && (0.0 < *local_10));
  return 0;
}

Assistant:

static GLFWbool waitForEvent(double* timeout)
{
    fd_set fds;
    const int fd = ConnectionNumber(_glfw.x11.display);
    int count = fd + 1;

#if defined(__linux__)
    if (_glfw.linjs.inotify > fd)
        count = _glfw.linjs.inotify + 1;
#endif
    for (;;)
    {
        FD_ZERO(&fds);
        FD_SET(fd, &fds);
#if defined(__linux__)
        if (_glfw.linjs.inotify > 0)
            FD_SET(_glfw.linjs.inotify, &fds);
#endif

        if (timeout)
        {
            const long seconds = (long) *timeout;
            const long microseconds = (long) ((*timeout - seconds) * 1e6);
            struct timeval tv = { seconds, microseconds };
            const uint64_t base = _glfwPlatformGetTimerValue();

            const int result = select(count, &fds, NULL, NULL, &tv);
            const int error = errno;

            *timeout -= (_glfwPlatformGetTimerValue() - base) /
                (double) _glfwPlatformGetTimerFrequency();

            if (result > 0)
                return GLFW_TRUE;
            if ((result == -1 && error == EINTR) || *timeout <= 0.0)
                return GLFW_FALSE;
        }
        else if (select(count, &fds, NULL, NULL, NULL) != -1 || errno != EINTR)
            return GLFW_TRUE;
    }
}